

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseVOffset(State *state)

{
  bool bVar1;
  undefined1 local_48 [8];
  State copy;
  State *state_local;
  
  copy._40_8_ = state;
  memcpy(local_48,state,0x30);
  bVar1 = ParseNumber((State *)copy._40_8_,(int *)0x0);
  if (((bVar1) && (bVar1 = ParseOneCharToken((State *)copy._40_8_,'_'), bVar1)) &&
     (bVar1 = ParseNumber((State *)copy._40_8_,(int *)0x0), bVar1)) {
    state_local._7_1_ = true;
  }
  else {
    memcpy((void *)copy._40_8_,local_48,0x30);
    state_local._7_1_ = false;
  }
  return state_local._7_1_;
}

Assistant:

static bool ParseVOffset(State *state) {
  State copy = *state;
  if (ParseNumber(state, NULL) && ParseOneCharToken(state, '_') &&
      ParseNumber(state, NULL)) {
    return true;
  }
  *state = copy;
  return false;
}